

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  char cVar1;
  char *pcVar2;
  size_type sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  bool bVar16;
  
  pcVar2 = (name_str->_M_dataplus)._M_p;
  sVar3 = name_str->_M_string_length;
  do {
    pcVar4 = strchr(filter,0x3a);
    pcVar6 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      sVar5 = strlen(filter);
      pcVar6 = filter + sVar5;
    }
    bVar15 = pcVar6 <= filter;
    bVar7 = (long)sVar3 < 1 && bVar15;
    pcVar9 = filter;
    pcVar12 = pcVar2;
    pcVar14 = pcVar2;
    bVar16 = (long)sVar3 < 1;
    if ((long)sVar3 >= 1 || !bVar15) {
      do {
        pcVar13 = pcVar14 + 1;
        pcVar11 = pcVar9;
        while (pcVar8 = pcVar9, pcVar10 = pcVar11 + 1, !bVar15) {
          cVar1 = *pcVar11;
          if (cVar1 != '*') {
            if (cVar1 == '?') {
              if (bVar16 == false) goto LAB_0023e354;
            }
            else if ((bVar16 == false) && (*pcVar14 == cVar1)) goto LAB_0023e354;
            break;
          }
          bVar15 = pcVar6 <= pcVar10;
          bVar7 = (bool)(bVar15 & bVar16);
          pcVar9 = pcVar8 + 1;
          filter = pcVar8;
          pcVar12 = pcVar13;
          pcVar11 = pcVar10;
          if (bVar7) goto LAB_0023e2b4;
        }
        if ((pcVar12 <= pcVar2) || (pcVar10 = filter, pcVar13 = pcVar12, pcVar2 + sVar3 < pcVar12))
        break;
LAB_0023e354:
        bVar16 = pcVar2 + sVar3 <= pcVar13;
        bVar15 = pcVar6 <= pcVar10;
        bVar7 = bVar15 && bVar16;
        pcVar9 = pcVar10;
        pcVar14 = pcVar13;
      } while (!bVar15 || !bVar16);
    }
LAB_0023e2b4:
    filter = pcVar4 + 1;
    if (pcVar4 == (char *)0x0 || bVar7) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  // The filter is a list of patterns separated by colons (:).
  const char* pattern = filter;
  while (true) {
    // Find the bounds of this pattern.
    const char* const next_sep = strchr(pattern, ':');
    const char* const pattern_end =
        next_sep != nullptr ? next_sep : pattern + strlen(pattern);

    // Check if this pattern matches name_str.
    if (PatternMatchesString(name_str, pattern, pattern_end)) {
      return true;
    }

    // Give up on this pattern. However, if we found a pattern separator (:),
    // advance to the next pattern (skipping over the separator) and restart.
    if (next_sep == nullptr) {
      return false;
    }
    pattern = next_sep + 1;
  }
  return true;
}